

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void operator_delete__(void *__ptr)

{
  PageID this;
  bool bVar1;
  int32_t iVar2;
  PageHeap *pPVar3;
  ulong uVar4;
  size_t sVar5;
  CentralFreeList *pCVar6;
  bool local_109;
  void *ptr_local;
  Span *span;
  bool cache_hit;
  ulong uStack_d8;
  uint32_t cl;
  PageID p;
  ThreadCache *heap;
  byte local_b9;
  _func_void_void_ptr *local_b8;
  void *local_b0;
  uint local_a4;
  long lStack_a0;
  uint32_t idx;
  ThreadCache *local_98;
  SizeMap *local_90;
  undefined1 local_81;
  uint *local_80;
  ThreadCache *local_78;
  char local_69;
  ulong local_68;
  PageHeap *local_60;
  ulong local_58;
  Number i2;
  Number i1;
  PageMap *local_40;
  Span *local_38;
  uint32_t local_2c;
  FreeList *pFStack_28;
  uint32_t length;
  FreeList *list;
  void *local_18;
  PageID local_10;
  
  bVar1 = base::internal::HookList<void_(*)(const_void_*)>::empty
                    ((HookList<void_(*)(const_void_*)> *)base::internal::delete_hooks_);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    tcmalloc::invoke_hooks_and_free(__ptr);
    return;
  }
  local_b8 = anon_unknown.dwarf_5370::InvalidFree;
  local_b9 = 0;
  heap = (ThreadCache *)0x0;
  local_b0 = __ptr;
  p = (PageID)tcmalloc::ThreadCachePtr::GetIfPresent();
  uStack_d8 = (ulong)local_b0 >> 0xd;
  if ((local_b9 & 1) != 0) {
    local_90 = tcmalloc::Static::sizemap();
    local_98 = heap;
    lStack_a0 = (long)&span + 4;
    local_78 = heap;
    local_80 = &local_a4;
    if (heap < (ThreadCache *)0x401) {
      local_a4 = (int)heap + 7U >> 3;
      local_69 = '\x01';
    }
    else if (heap < (ThreadCache *)0x40001) {
      local_a4 = (int)heap + 0x3c7fU >> 7;
      local_69 = '\x01';
    }
    else {
      local_69 = '\0';
    }
    local_81 = local_69 != '\0';
    if ((bool)local_81) {
      span._4_4_ = (uint)local_90->class_array_[local_a4];
      goto LAB_00122a0e;
    }
  }
  local_109 = false;
  if ((local_b9 & 1) == 0) {
    pPVar3 = tcmalloc::Static::pageheap();
    local_109 = tcmalloc::PageHeap::TryGetSizeClass(pPVar3,uStack_d8,(uint32_t *)((long)&span + 4));
  }
  span._3_1_ = local_109;
  if (((local_109 ^ 0xffU) & 1) != 0) {
    local_60 = tcmalloc::Static::pageheap();
    local_68 = uStack_d8;
    local_40 = &local_60->pagemap_;
    i1 = uStack_d8;
    i2 = uStack_d8 >> 0x12;
    local_58 = uStack_d8 & 0x3ffff;
    if ((uStack_d8 >> 0x23 == 0) && (local_40->root_[i2] != (Leaf *)0x0)) {
      local_38 = (Span *)local_40->root_[i2]->values[local_58];
    }
    else {
      local_38 = (Span *)0x0;
    }
    if (local_38 == (Span *)0x0) {
      anon_unknown.dwarf_5370::free_null_or_invalid(local_b0,local_b8);
      return;
    }
    span._4_4_ = *(uint *)&local_38->field_0x28 >> 0x10 & 0xff;
    if (span._4_4_ == 0) {
      anon_unknown.dwarf_5370::do_free_pages(local_38,local_b0);
      return;
    }
    if ((local_b9 & 1) == 0) {
      pPVar3 = tcmalloc::Static::pageheap();
      tcmalloc::PageHeap::SetCachedSizeClass(pPVar3,uStack_d8,span._4_4_);
    }
  }
LAB_00122a0e:
  this = p;
  if (p == 0) {
    bVar1 = tcmalloc::Static::IsInited();
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcmalloc::SLL_SetNext(local_b0,(void *)0x0);
      pCVar6 = tcmalloc::Static::central_cache();
      tcmalloc::CentralFreeList::InsertRange(pCVar6 + span._4_4_,local_b0,local_b0,1);
    }
    else {
      anon_unknown.dwarf_5370::free_null_or_invalid(local_b0,local_b8);
    }
  }
  else {
    local_10 = p;
    local_18 = local_b0;
    list._4_4_ = span._4_4_;
    pFStack_28 = (FreeList *)(p + (ulong)span._4_4_ * 0x20);
    local_2c = tcmalloc::ThreadCache::FreeList::Push(pFStack_28,local_b0);
    uVar4 = (ulong)local_2c;
    sVar5 = tcmalloc::ThreadCache::FreeList::max_length(pFStack_28);
    if (sVar5 < uVar4) {
      tcmalloc::ThreadCache::ListTooLong((ThreadCache *)this,pFStack_28,list._4_4_);
    }
    else {
      iVar2 = tcmalloc::ThreadCache::FreeList::object_size(pFStack_28);
      *(int32_t *)(this + 0x1000) = iVar2 + *(int *)(this + 0x1000);
      if (*(int *)(this + 0x1004) < *(int *)(this + 0x1000)) {
        tcmalloc::ThreadCache::Scavenge((ThreadCache *)this);
      }
    }
  }
  return;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void tc_free(void* ptr) PERFTOOLS_NOTHROW {
  free_fast_path(ptr);
}